

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall
chrono::ChBody::IntLoadResidual_Mv
          (ChBody *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  char *__function;
  double *pdVar28;
  ulong uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double *local_78;
  double adStack_70 [2];
  ChVectorDynamic<> *pCStack_60;
  ulong uStack_58;
  long lStack_50;
  ulong uStack_48;
  ChVector<double> CStack_40;
  
  uStack_48 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar29 = (ulong)off;
  if ((long)uStack_48 <= (long)uVar29) {
LAB_0050707f:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  uVar26 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar26 <= (long)uVar29) {
LAB_0050709e:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  local_78 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar28 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_78[uVar29];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = pdVar28[uVar29];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = c * (this->variables).mass;
  auVar3 = vfmadd213sd_fma(auVar34,auVar38,auVar3);
  pdVar28[uVar29] = auVar3._0_8_;
  uVar29 = (ulong)(off + 1);
  if (uStack_48 <= uVar29) goto LAB_0050707f;
  if (uVar26 <= uVar29) goto LAB_0050709e;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_78[uVar29];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = pdVar28[uVar29];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = c * (this->variables).mass;
  auVar3 = vfmadd213sd_fma(auVar35,auVar39,auVar4);
  pdVar28[uVar29] = auVar3._0_8_;
  uVar29 = (ulong)(off + 2);
  if (uStack_48 <= uVar29) goto LAB_0050707f;
  if (uVar26 <= uVar29) goto LAB_0050709e;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_78[uVar29];
  uVar26 = (ulong)(off + 3);
  local_78 = local_78 + uVar26;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = pdVar28[uVar29];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = c * (this->variables).mass;
  auVar3 = vfmadd213sd_fma(auVar36,auVar40,auVar5);
  pdVar28[uVar29] = auVar3._0_8_;
  adStack_70[0] = 1.48219693752374e-323;
  pCStack_60 = w;
  uStack_58 = uVar26;
  if ((long)(uStack_48 - 3) < (long)uVar26) {
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
LAB_005070e9:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
  }
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&CStack_40,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
              *)&local_78,(type *)0x0);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = CStack_40.m_data[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = CStack_40.m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       CStack_40.m_data[1] *
       *(double *)
        ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  auVar3 = vfmadd231sd_fma(auVar41,auVar33,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x18);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       CStack_40.m_data[1] *
       *(double *)
        ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x20);
  auVar34 = vfmadd231sd_fma(auVar43,auVar33,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x30);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       CStack_40.m_data[1] *
       *(double *)
        ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar38 = vfmadd231sd_fma(auVar37,auVar33,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x10);
  auVar3 = vfmadd231sd_fma(auVar3,auVar42,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x28);
  auVar34 = vfmadd231sd_fma(auVar34,auVar42,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar38 = vfmadd231sd_fma(auVar38,auVar42,auVar11);
  local_78 = (double *)(auVar3._0_8_ * c);
  adStack_70[0] = auVar34._0_8_ * c;
  adStack_70[1] = auVar38._0_8_ * c;
  if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
      (long)uVar26) {
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
    goto LAB_005070e9;
  }
  pdVar28 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
            uVar26;
  uVar25 = 3;
  if (((ulong)pdVar28 & 7) == 0) {
    uVar27 = -((uint)((ulong)pdVar28 >> 3) & 0x1fffffff) & 7;
    if (uVar27 < 3) {
      uVar25 = uVar27;
    }
    if (uVar27 == 0) goto LAB_0050702f;
  }
  auVar31 = vpbroadcastq_avx512f();
  uVar29 = vpcmpuq_avx512f(auVar31,_DAT_009551c0,5);
  bVar12 = (byte)uVar29;
  auVar31._8_8_ = (ulong)((byte)(uVar29 >> 1) & 1) * (long)adStack_70[0];
  auVar31._0_8_ = (ulong)(bVar12 & 1) * (long)local_78;
  auVar31._16_8_ = (ulong)((byte)(uVar29 >> 2) & 1) * (long)adStack_70[1];
  auVar31._24_8_ = (ulong)((byte)(uVar29 >> 3) & 1) * (long)pCStack_60;
  auVar31._32_8_ = ((byte)(uVar29 >> 4) & 1) * uStack_58;
  auVar31._40_8_ = (ulong)((byte)(uVar29 >> 5) & 1) * lStack_50;
  auVar31._48_8_ = ((byte)(uVar29 >> 6) & 1) * uStack_48;
  auVar31._56_8_ = (uVar29 >> 7) * (long)CStack_40.m_data[0];
  auVar32._8_8_ = (ulong)((byte)(uVar29 >> 1) & 1) * (long)pdVar28[1];
  auVar32._0_8_ = (ulong)(bVar12 & 1) * (long)*pdVar28;
  auVar32._16_8_ = (ulong)((byte)(uVar29 >> 2) & 1) * (long)pdVar28[2];
  auVar32._24_8_ = (ulong)((byte)(uVar29 >> 3) & 1) * (long)pdVar28[3];
  auVar32._32_8_ = (ulong)((byte)(uVar29 >> 4) & 1) * (long)pdVar28[4];
  auVar32._40_8_ = (ulong)((byte)(uVar29 >> 5) & 1) * (long)pdVar28[5];
  auVar32._48_8_ = (ulong)((byte)(uVar29 >> 6) & 1) * (long)pdVar28[6];
  auVar32._56_8_ = (uVar29 >> 7) * (long)pdVar28[7];
  auVar31 = vaddpd_avx512f(auVar31,auVar32);
  bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
  bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
  bVar15 = (bool)((byte)(uVar29 >> 3) & 1);
  bVar16 = (bool)((byte)(uVar29 >> 4) & 1);
  bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
  bVar18 = (bool)((byte)(uVar29 >> 6) & 1);
  *pdVar28 = (double)((ulong)(bVar12 & 1) * auVar31._0_8_ |
                     (ulong)!(bool)(bVar12 & 1) * (long)*pdVar28);
  pdVar28[1] = (double)((ulong)bVar13 * auVar31._8_8_ | (ulong)!bVar13 * (long)pdVar28[1]);
  pdVar28[2] = (double)((ulong)bVar14 * auVar31._16_8_ | (ulong)!bVar14 * (long)pdVar28[2]);
  pdVar28[3] = (double)((ulong)bVar15 * auVar31._24_8_ | (ulong)!bVar15 * (long)pdVar28[3]);
  pdVar28[4] = (double)((ulong)bVar16 * auVar31._32_8_ | (ulong)!bVar16 * (long)pdVar28[4]);
  pdVar28[5] = (double)((ulong)bVar17 * auVar31._40_8_ | (ulong)!bVar17 * (long)pdVar28[5]);
  pdVar28[6] = (double)((ulong)bVar18 * auVar31._48_8_ | (ulong)!bVar18 * (long)pdVar28[6]);
  pdVar28[7] = (double)((uVar29 >> 7) * auVar31._56_8_ |
                       (ulong)!SUB81(uVar29 >> 7,0) * (long)pdVar28[7]);
LAB_0050702f:
  if (uVar25 < 3) {
    uVar26 = (ulong)(uVar25 << 3);
    auVar30 = vpbroadcastq_avx512vl();
    uVar29 = vpcmpuq_avx512vl(auVar30,_DAT_00955380,5);
    uVar29 = uVar29 & 0xf;
    lVar19 = *(long *)((long)adStack_70 + uVar26);
    lVar20 = *(long *)((long)adStack_70 + uVar26 + 8);
    lVar21 = *(long *)((long)&pCStack_60 + uVar26);
    bVar12 = (byte)uVar29;
    plVar1 = (long *)((long)pdVar28 + uVar26);
    lVar22 = plVar1[1];
    lVar23 = plVar1[2];
    lVar24 = plVar1[3];
    puVar2 = (ulong *)((long)pdVar28 + uVar26);
    bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
    bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
    *puVar2 = (ulong)(bVar12 & 1) *
              (long)((double)((ulong)(bVar12 & 1) * *(long *)((long)&local_78 + uVar26)) +
                    (double)((ulong)(bVar12 & 1) * *plVar1)) | (ulong)!(bool)(bVar12 & 1) * *puVar2;
    puVar2[1] = (ulong)bVar13 *
                (long)((double)((ulong)((byte)(uVar29 >> 1) & 1) * lVar19) +
                      (double)((ulong)((byte)(uVar29 >> 1) & 1) * lVar22)) |
                (ulong)!bVar13 * puVar2[1];
    puVar2[2] = (ulong)bVar14 *
                (long)((double)((ulong)((byte)(uVar29 >> 2) & 1) * lVar20) +
                      (double)((ulong)((byte)(uVar29 >> 2) & 1) * lVar23)) |
                (ulong)!bVar14 * puVar2[2];
    puVar2[3] = (uVar29 >> 3) *
                (long)((double)((uVar29 >> 3) * lVar21) + (double)((uVar29 >> 3) * lVar24)) |
                (ulong)!SUB81(uVar29 >> 3,0) * puVar2[3];
  }
  return;
}

Assistant:

void ChBody::IntLoadResidual_Mv(const unsigned int off,      // offset in R residual
                                ChVectorDynamic<>& R,        // result: the R residual, R += c*M*v
                                const ChVectorDynamic<>& w,  // the w vector
                                const double c               // a scaling factor
) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    ChVector<> Iw = GetInertia() * ChVector<>(w.segment(off + 3, 3));
    Iw *= c;
    R.segment(off + 3, 3) += Iw.eigen();
}